

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
          (cmFileListGeneratorCaseInsensitive *this,string *str)

{
  pointer pcVar1;
  
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorCaseInsensitive_007842f0;
  (this->String)._M_dataplus._M_p = (pointer)&(this->String).field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->String,pcVar1,pcVar1 + str->_M_string_length);
  return;
}

Assistant:

cmFileListGeneratorCaseInsensitive(std::string const& str)
    : cmFileListGeneratorBase()
    , String(str)
  {
  }